

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.cpp
# Opt level: O2

void __thiscall qclab::io::QASMFile::parse(QASMFile *this)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  string *delimiter;
  pointer str_00;
  allocator<char> local_f1;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar3 = false;
  while( true ) {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) break;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)this,(string *)&str);
    _Var5 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_pred<int_(*)(int)_noexcept>)isspace);
    std::__cxx11::string::erase(&str,_Var5._M_current,str._M_dataplus._M_p + str._M_string_length);
    if (str._M_string_length != 0) {
      delimiter = (string *)0x2;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&str);
      bVar2 = std::operator==(&local_50,"//");
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,";",(allocator<char> *)&local_50);
        split<std::__cxx11::string>(&commands,(io *)&str,&local_70,delimiter);
        std::__cxx11::string::~string((string *)&local_70);
        pbVar1 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (str_00 = commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; str_00 != pbVar1;
            str_00 = str_00 + 1) {
          if (bVar3) {
            bVar3 = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->gateCommands_,str_00);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_50,(ulong)str_00);
            bVar3 = std::operator==(&local_50,"qreg");
            std::__cxx11::string::~string((string *)&local_50);
            if (bVar3) {
              std::__cxx11::string::substr((ulong)&local_50,(ulong)str_00);
              std::__cxx11::string::operator=((string *)str_00,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"[",&local_f1);
              left_of(&local_50,str_00,&local_90);
              std::__cxx11::string::operator=((string *)&this->qregName_,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"]",&local_f1);
              left_of(&local_50,str_00,&local_b0);
              iVar4 = read_value<int>(&local_50);
              this->nbQubits_ = iVar4;
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_b0);
              bVar3 = true;
            }
            else {
              bVar3 = false;
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&commands);
      }
    }
    std::__cxx11::string::~string((string *)&str);
  }
  return;
}

Assistant:

void QASMFile::parse() {

    bool hasQreg = false ;

    // loop over lines in file
    while ( not stream_.eof() ) {

      // new line + remove all whitespaces
      std::string str ;
      std::getline( stream_ , str ) ;
      str.erase( remove_if( str.begin() , str.end() , isspace ) , str.end() ) ;

      // skip blank and comment lines
      if ( str.length() < 1 ) { continue ; }
      if ( str.substr( 0 , 2 ) == "//" ) { continue ; }

      // split commands on this line
      auto commands = split< std::string >( str , ";" ) ;

      // parse commands
      for ( auto& command : commands ) {
        if ( !hasQreg ) {
          if ( command.substr( 0 , 4 ) == "qreg" ) {
            // set quantum register
            command = command.substr( 4 ) ;
            qregName_ = left_of( command , "[" ) ;
            nbQubits_ = read_value< int >( left_of( command , "]" ) ) ;
            hasQreg = true ;
          }
        } else {
          // read gates
          gateCommands_.push_back( command ) ;
        }
      }

    }

  }